

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_resolve.cpp
# Opt level: O0

bool __thiscall
BamTools::ResolveTool::StatsFileReader::Read
          (StatsFileReader *this,ResolveSettings *settings,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ReadGroupResolver,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ReadGroupResolver>_>_>
          *readGroups)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  long in_RSI;
  StatsFileReader *in_RDI;
  bool foundError;
  string line;
  State currentState;
  ResolveSettings *in_stack_00000158;
  string *in_stack_00000160;
  StatsFileReader *in_stack_00000168;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ReadGroupResolver,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ReadGroupResolver>_>_>
  *in_stack_00000268;
  string *in_stack_00000270;
  StatsFileReader *in_stack_00000278;
  string *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff74;
  undefined1 in_stack_ffffffffffffff75;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 in_stack_ffffffffffffff77;
  string local_80 [32];
  undefined4 local_60;
  byte local_49;
  StatsFileReader *in_stack_ffffffffffffffb8;
  int local_24;
  bool local_1;
  
  uVar3 = std::ifstream::is_open();
  if (((uVar3 & 1) == 0) || (in_RSI == 0)) {
    local_1 = false;
  }
  else {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ReadGroupResolver,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ReadGroupResolver>_>_>
    ::clear((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ReadGroupResolver,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ReadGroupResolver>_>_>
             *)0x223196);
    local_24 = 0;
    SkipCommentsAndWhitespace_abi_cxx11_(in_stack_ffffffffffffffb8);
    while (bVar1 = std::__cxx11::string::empty(), ((bVar1 ^ 0xff) & 1) != 0) {
      local_49 = 0;
      in_stack_ffffffffffffff77 =
           Utilities::StartsWith
                     ((string *)
                      CONCAT17(in_stack_ffffffffffffff77,
                               CONCAT16(in_stack_ffffffffffffff76,
                                        CONCAT15(in_stack_ffffffffffffff75,
                                                 CONCAT14(in_stack_ffffffffffffff74,
                                                          in_stack_ffffffffffffff70)))),
                      in_stack_ffffffffffffff68);
      if ((bool)in_stack_ffffffffffffff77) {
        local_24 = 1;
      }
      else {
        in_stack_ffffffffffffff76 =
             Utilities::StartsWith
                       ((string *)
                        CONCAT17(in_stack_ffffffffffffff77,
                                 CONCAT16(in_stack_ffffffffffffff76,
                                          CONCAT15(in_stack_ffffffffffffff75,
                                                   CONCAT14(in_stack_ffffffffffffff74,
                                                            in_stack_ffffffffffffff70)))),
                        in_stack_ffffffffffffff68);
        if ((bool)in_stack_ffffffffffffff76) {
          local_24 = 2;
        }
        else {
          in_stack_ffffffffffffff75 =
               Utilities::StartsWith
                         ((string *)
                          CONCAT17(in_stack_ffffffffffffff77,
                                   CONCAT16(in_stack_ffffffffffffff76,
                                            CONCAT15(in_stack_ffffffffffffff75,
                                                     CONCAT14(in_stack_ffffffffffffff74,
                                                              in_stack_ffffffffffffff70)))),
                          in_stack_ffffffffffffff68);
          if ((bool)in_stack_ffffffffffffff75) {
            local_24 = 3;
          }
          else if (local_24 == 1) {
            bVar2 = ParseInputLine(in_RDI,(string *)&stack0xffffffffffffffb8);
            local_49 = (bVar2 ^ 0xffU) & 1;
          }
          else if (local_24 == 2) {
            in_stack_ffffffffffffff74 =
                 ParseOptionLine(in_stack_00000168,in_stack_00000160,in_stack_00000158);
            local_49 = (in_stack_ffffffffffffff74 ^ 0xff) & 1;
          }
          else if (local_24 == 3) {
            bVar2 = ParseReadGroupLine(in_stack_00000278,in_stack_00000270,in_stack_00000268);
            in_stack_ffffffffffffff70 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff70);
            local_49 = (bVar2 ^ 0xffU) & 1;
          }
          else {
            local_49 = 1;
          }
        }
      }
      if ((local_49 & 1) != 0) {
        local_1 = false;
        goto LAB_00223356;
      }
      SkipCommentsAndWhitespace_abi_cxx11_(in_stack_ffffffffffffffb8);
      std::__cxx11::string::operator=((string *)&stack0xffffffffffffffb8,local_80);
      std::__cxx11::string::~string(local_80);
    }
    local_1 = true;
LAB_00223356:
    local_60 = 1;
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  }
  return local_1;
}

Assistant:

bool ResolveTool::StatsFileReader::Read(ResolveTool::ResolveSettings* settings,
                                        std::map<std::string, ReadGroupResolver>& readGroups)
{
    // up-front sanity checks
    if (!m_stream.is_open() || settings == 0) return false;

    // clear out read group data
    readGroups.clear();

    // initialize state
    State currentState = StatsFileReader::None;

    // read stats file
    std::string line = SkipCommentsAndWhitespace();
    while (!line.empty()) {

        bool foundError = false;

        // switch state on keyword found
        if (Utilities::StartsWith(line, INPUT_TOKEN))
            currentState = StatsFileReader::InInput;
        else if (Utilities::StartsWith(line, OPTIONS_TOKEN))
            currentState = StatsFileReader::InOptions;
        else if (Utilities::StartsWith(line, READGROUPS_TOKEN))
            currentState = StatsFileReader::InReadGroups;

        // otherwise parse data line, depending on state
        else {
            if (currentState == StatsFileReader::InInput)
                foundError = !ParseInputLine(line);
            else if (currentState == StatsFileReader::InOptions)
                foundError = !ParseOptionLine(line, settings);
            else if (currentState == StatsFileReader::InReadGroups)
                foundError = !ParseReadGroupLine(line, readGroups);
            else
                foundError = true;
        }

        // break out if error found
        if (foundError) return false;

        // get next line
        line = SkipCommentsAndWhitespace();
    }

    // if here, return success
    return true;
}